

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O1

Ptr __thiscall core::image::desaturate<float>(image *this,ConstPtr *img,DesaturateType type)

{
  int iVar1;
  element_type *peVar2;
  long *plVar3;
  code *pcVar4;
  long lVar5;
  Image<float> *__p;
  invalid_argument *piVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  Ptr PVar14;
  
  peVar2 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Null image given");
  }
  else {
    iVar1 = (peVar2->super_TypedImageBase<float>).super_ImageBase.c;
    if (0xfffffffd < iVar1 - 5U) {
      __p = (Image<float> *)operator_new(0x30);
      (__p->super_TypedImageBase<float>).super_ImageBase.w = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.h = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.c = 0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
           (_func_int **)&PTR__TypedImageBase_00130b60;
      *(Image<float> **)this = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
      plVar3 = *(long **)this;
      peVar2 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar11 = (peVar2->super_TypedImageBase<float>).super_ImageBase.w;
      iVar7 = (peVar2->super_TypedImageBase<float>).super_ImageBase.h;
      (**(code **)(*plVar3 + 0x40))(plVar3);
      iVar9 = (iVar1 == 4) + 1;
      *(int *)(plVar3 + 1) = iVar11;
      *(int *)((long)plVar3 + 0xc) = iVar7;
      *(int *)(plVar3 + 2) = iVar9;
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)(plVar3 + 3),
                 (long)(iVar7 * iVar11 << (iVar1 == 4)));
      if (type < (DESATURATE_AVERAGE|DESATURATE_LIGHTNESS)) {
        peVar2 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar11 = (peVar2->super_TypedImageBase<float>).super_ImageBase.h *
                 (peVar2->super_TypedImageBase<float>).super_ImageBase.w;
        _Var8._M_pi = extraout_RDX;
        if (0 < iVar11) {
          pcVar4 = (code *)(&PTR_desaturate_maximum<float>_00130cd0)[type];
          uVar12 = 0 << (iVar1 == 4);
          lVar10 = 4;
          do {
            uVar13 = (*pcVar4)((((img->
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->super_TypedImageBase<float>).data.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar12);
            lVar5 = *(long *)(*(long *)this + 0x18);
            *(undefined4 *)(lVar5 + -4 + lVar10) = uVar13;
            iVar7 = 3;
            if (iVar1 == 4) {
              *(float *)(lVar5 + lVar10) =
                   (((img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr)->super_TypedImageBase<float>).data.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start[(ulong)uVar12 + 3];
              iVar7 = 4;
            }
            uVar12 = uVar12 + iVar7;
            lVar10 = lVar10 + (ulong)(uint)(iVar9 * 4);
            iVar11 = iVar11 + -1;
            _Var8._M_pi = extraout_RDX_00;
          } while (iVar11 != 0);
        }
        PVar14.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = _Var8._M_pi;
        PVar14.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (Ptr)PVar14.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
      }
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Invalid desaturate type");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Image must be RGB or RGBA");
  }
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
desaturate (typename Image<T>::ConstPtr img, DesaturateType type)
{
    if (img == nullptr)
        throw std::invalid_argument("Null image given");

    int ic = img->channels();
    if (ic != 3 && ic != 4)
        throw std::invalid_argument("Image must be RGB or RGBA");

    bool has_alpha = (ic == 4);

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(img->width(), img->height(), 1 + has_alpha);

    typedef T(*DesaturateFunc)(T const*);
    DesaturateFunc func;
    switch (type)
    {
        case DESATURATE_MAXIMUM: func = desaturate_maximum<T>; break;
        case DESATURATE_LIGHTNESS: func = desaturate_lightness<T>; break;
        case DESATURATE_LUMINOSITY: func = desaturate_luminosity<T>; break;
        case DESATURATE_LUMINANCE: func = desaturate_luminance<T>; break;
        case DESATURATE_AVERAGE: func = desaturate_average<T>; break;
        default: throw std::invalid_argument("Invalid desaturate type");
    }

    int outpos = 0;
    int inpos = 0;
    int pixels = img->get_pixel_amount();
    for (int i = 0; i < pixels; ++i)
    {
        T const* v = &img->at(inpos);
        out->at(outpos) = func(v);

        if (has_alpha)
            out->at(outpos + 1) = img->at(inpos + 3);

        outpos += 1 + has_alpha;
        inpos += 3 + has_alpha;
    }

    return out;
}